

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

bool __thiscall tonk::OutgoingQueue::PopIsEmpty(OutgoingQueue *this)

{
  OutgoingQueuedDatagram *pOVar1;
  OutgoingQueuedDatagram *pOVar2;
  
  pOVar1 = this->OldestQueued;
  pOVar2 = pOVar1->Next;
  this->OldestQueued = pOVar2;
  this->QueuedBytes = this->QueuedBytes - pOVar1->NextWriteOffset;
  if (pOVar2 == (OutgoingQueuedDatagram *)0x0) {
    this->NewestQueued = (OutgoingQueuedDatagram *)0x0;
  }
  return pOVar2 == (OutgoingQueuedDatagram *)0x0;
}

Assistant:

bool OutgoingQueue::PopIsEmpty()
{
    OutgoingQueuedDatagram* datagram = OldestQueued;
    TONK_DEBUG_ASSERT(datagram != nullptr);

    // Advance the list head
    OldestQueued = datagram->Next;

    // Update queued bytes
    TONK_DEBUG_ASSERT(QueuedBytes >= datagram->NextWriteOffset);
    QueuedBytes -= datagram->NextWriteOffset;

    // If this was the end of the list:
    if (!OldestQueued)
    {
        NewestQueued = nullptr;
        return true;
    }

    return false;
}